

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_stm(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  TCGv_i64 pTVar1;
  TCGv_i64 pTVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TCGv_i64 arg2;
  TCGv_i64 tsize;
  int size;
  int r3;
  int r1;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  size = get_field1(s,FLD_O_r1,FLD_C_b1);
  iVar3 = get_field1(s,FLD_O_r3,FLD_C_i3);
  iVar4 = (int)s->insn->data;
  arg2 = tcg_const_i64_s390x(tcg_ctx_00,(long)iVar4);
  while( true ) {
    if (iVar4 == 8) {
      pTVar1 = tcg_ctx_00->regs[size];
      pTVar2 = o->in2;
      iVar5 = get_mem_index(s);
      tcg_gen_qemu_st64(tcg_ctx_00,pTVar1,pTVar2,iVar5);
    }
    else {
      pTVar1 = tcg_ctx_00->regs[size];
      pTVar2 = o->in2;
      iVar5 = get_mem_index(s);
      tcg_gen_qemu_st32(tcg_ctx_00,pTVar1,pTVar2,iVar5);
    }
    if (size == iVar3) break;
    tcg_gen_add_i64(tcg_ctx_00,o->in2,o->in2,arg2);
    size = size + 1U & 0xf;
  }
  tcg_temp_free_i64(tcg_ctx_00,arg2);
  return DISAS_NEXT;
}

Assistant:

static bool op_stm(DisasContext *s, arg_ldst_block *a, int min_n)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int i, j, n, list, mem_idx;
    bool user = a->u;
    TCGv_i32 addr, tmp, tmp2;

    if (user) {
        /* STM (user) */
        if (IS_USER(s)) {
            /* Only usable in supervisor mode.  */
            unallocated_encoding(s);
            return true;
        }
    }

    list = a->list;
    n = ctpop16(list);
    if (n < min_n || a->rn == 15) {
        unallocated_encoding(s);
        return true;
    }

    addr = op_addr_block_pre(s, a, n);
    mem_idx = get_mem_index(s);

    for (i = j = 0; i < 16; i++) {
        if (!(list & (1 << i))) {
            continue;
        }

        if (user && i != 15) {
            tmp = tcg_temp_new_i32(tcg_ctx);
            tmp2 = tcg_const_i32(tcg_ctx, i);
            gen_helper_get_user_reg(tcg_ctx, tmp, tcg_ctx->cpu_env, tmp2);
            tcg_temp_free_i32(tcg_ctx, tmp2);
        } else {
            tmp = load_reg(s, i);
        }
        gen_aa32_st32(s, tmp, addr, mem_idx);
        tcg_temp_free_i32(tcg_ctx, tmp);

        /* No need to add after the last transfer.  */
        if (++j != n) {
            tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);
        }
    }

    op_addr_block_post(s, a, addr, n);
    return true;
}